

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

int lws_check_utf8(uchar *state,uchar *buf,size_t len)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  byte local_29;
  uchar c;
  size_t sStack_28;
  uchar s;
  size_t len_local;
  uchar *buf_local;
  uchar *state_local;
  
  local_29 = *state;
  sStack_28 = len;
  len_local = (size_t)buf;
  while( true ) {
    while( true ) {
      sVar2 = sStack_28 - 1;
      if (sStack_28 == 0) {
        *state = local_29;
        return 0;
      }
      sVar3 = len_local + 1;
      bVar1 = *(byte *)len_local;
      sStack_28 = sVar2;
      len_local = sVar3;
      if (local_29 != 0) break;
      if (0x7f < bVar1) {
        if ((bVar1 < 0xc2) || (0xf4 < bVar1)) {
          return 1;
        }
        if (bVar1 < 0xe0) {
          local_29 = 0x8c;
        }
        else {
          local_29 = e0f4[(int)(bVar1 - 0xe0)];
        }
      }
    }
    if ((bVar1 < (local_29 & 0xf0)) ||
       ((local_29 & 0xf0) + 0x10 + (local_29 & 0xc) * 4 <= (uint)bVar1)) break;
    local_29 = e0f4[(int)((local_29 & 3) + 0x15)];
  }
  return 1;
}

Assistant:

int
lws_check_utf8(unsigned char *state, unsigned char *buf, size_t len)
{
	unsigned char s = *state;

	while (len--) {
		unsigned char c = *buf++;

		if (!s) {
			if (c >= 0x80) {
				if (c < 0xc2 || c > 0xf4)
					return 1;
				if (c < 0xe0)
					s = 0x80 | ((4 - 1) << 2);
				else
					s = e0f4[c - 0xe0];
			}
		} else {
			if (c < (s & 0xf0) ||
			    c >= (s & 0xf0) + 0x10 + ((s << 2) & 0x30))
				return 1;
			s = e0f4[21 + (s & 3)];
		}
	}

	*state = s;

	return 0;
}